

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr
GetGenericClassTypeName(ExpressionContext *ctx,TypeBase *proto,IntrusiveList<TypeHandle> generics)

{
  TypeBase *pTVar1;
  char *pcVar2;
  undefined4 extraout_var;
  ulong uVar3;
  size_t sVar4;
  TypeHandle *pTVar5;
  int iVar6;
  uint uVar7;
  char *__dest;
  TypeHandle *pTVar8;
  InplaceStr IVar9;
  
  uVar7 = (*(int *)&(proto->name).end - *(int *)&(proto->name).begin) + 3;
  pTVar5 = generics.head;
  while (pTVar5 != (TypeHandle *)0x0) {
    pTVar1 = pTVar5->type;
    iVar6 = 7;
    if (pTVar1->isGeneric == false) {
      iVar6 = *(int *)&(pTVar1->name).end - *(int *)&(pTVar1->name).begin;
    }
    pTVar5 = pTVar5->next;
    uVar7 = (uVar7 + iVar6 + 1) - (uint)(pTVar5 == (TypeHandle *)0x0);
  }
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar7);
  IVar9.begin = (char *)CONCAT44(extraout_var,iVar6);
  pcVar2 = (proto->name).begin;
  memcpy(IVar9.begin,pcVar2,(ulong)(uint)(*(int *)&(proto->name).end - (int)pcVar2));
  pcVar2 = IVar9.begin + (uint)(*(int *)&(proto->name).end - *(int *)&(proto->name).begin);
  __dest = pcVar2 + 1;
  pcVar2[0] = '<';
  pcVar2[1] = '\0';
  pTVar5 = generics.head;
  while (pTVar8 = pTVar5, pTVar8 != (TypeHandle *)0x0) {
    pTVar1 = pTVar8->type;
    if (pTVar1->isGeneric == true) {
      builtin_strncpy(__dest,"generic",8);
      uVar3 = 7;
    }
    else {
      pcVar2 = (pTVar1->name).begin;
      memcpy(__dest,pcVar2,(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar2));
      uVar3 = (ulong)(uint)(*(int *)&(pTVar8->type->name).end - *(int *)&(pTVar8->type->name).begin)
      ;
    }
    __dest = __dest + uVar3;
    pTVar5 = (TypeHandle *)0x0;
    if (pTVar8->next != (TypeHandle *)0x0) {
      *__dest = ',';
      __dest = __dest + 1;
      pTVar5 = pTVar8->next;
    }
  }
  __dest[0] = '>';
  __dest[1] = '\0';
  sVar4 = strlen(IVar9.begin);
  if (sVar4 + 1 == (ulong)uVar7) {
    IVar9.end = IVar9.begin + sVar4;
    return IVar9;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x108,
                "InplaceStr GetGenericClassTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

InplaceStr GetGenericClassTypeName(ExpressionContext &ctx, TypeBase* proto, IntrusiveList<TypeHandle> generics)
{
	unsigned nameLength = proto->name.length() + unsigned(strlen("<>")) + 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
			nameLength += unsigned(strlen("generic"));
		else
			nameLength += arg->type->name.length();

		if(arg->next)
			nameLength += 1;
	}

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, proto->name.begin, proto->name.length());
	pos += proto->name.length();

	strcpy(pos, "<");
	pos += 1;

	for(TypeHandle *arg = generics.head; arg; arg = arg->next)
	{
		if(arg->type->isGeneric)
		{
			strcpy(pos, "generic");
			pos += strlen("generic");
		}
		else
		{
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
			pos += arg->type->name.length();
		}

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = '>';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}